

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  int iVar1;
  Mat local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->scale_in_data_size,1);
  ncnn::Mat::operator=(&this->scale_in_data,&local_70);
  ncnn::Mat::~Mat(&local_70);
  iVar1 = -100;
  if (((this->scale_in_data).data != (void *)0x0) &&
     ((long)(this->scale_in_data).c * (this->scale_in_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->scale_out_data_size,1);
    ncnn::Mat::operator=(&this->scale_out_data,&local_70);
    ncnn::Mat::~Mat(&local_70);
    if (((this->scale_out_data).data != (void *)0x0) &&
       ((long)(this->scale_out_data).c * (this->scale_out_data).cstep != 0)) {
      if (this->bias_data_size != 0) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->bias_data_size,1);
        ncnn::Mat::operator=(&this->bias_data,&local_70);
        ncnn::Mat::~Mat(&local_70);
        if ((this->bias_data).data == (void *)0x0) {
          return -100;
        }
        if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
          return -100;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    scale_in_data = mb.load(scale_in_data_size, 1);
    if (scale_in_data.empty())
        return -100;

    scale_out_data = mb.load(scale_out_data_size, 1);
    if (scale_out_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}